

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O0

double log(double __x)

{
  bool bVar1;
  reference __args;
  function<void_(const_std::shared_ptr<LogOutput>_&)> *in_RDI;
  double extraout_XMM0_Qa;
  shared_ptr<LogOutput> *out;
  iterator __end1;
  iterator __begin1;
  Set<std::shared_ptr<LogOutput>_> *__range1;
  lock_guard<std::mutex> local_48;
  lock_guard<std::mutex> lock;
  Set<std::shared_ptr<LogOutput>_> logs;
  function<void_(const_std::shared_ptr<LogOutput>_&)> *func_local;
  
  Set<std::shared_ptr<LogOutput>_>::Set((Set<std::shared_ptr<LogOutput>_> *)&lock);
  std::lock_guard<std::mutex>::lock_guard(&local_48,&sOutputsMutex);
  Set<std::shared_ptr<LogOutput>_>::operator=((Set<std::shared_ptr<LogOutput>_> *)&lock,&sOutputs);
  std::lock_guard<std::mutex>::~lock_guard(&local_48);
  __end1 = std::
           set<std::shared_ptr<LogOutput>,_std::less<std::shared_ptr<LogOutput>_>,_std::allocator<std::shared_ptr<LogOutput>_>_>
           ::begin((set<std::shared_ptr<LogOutput>,_std::less<std::shared_ptr<LogOutput>_>,_std::allocator<std::shared_ptr<LogOutput>_>_>
                    *)&lock);
  out = (shared_ptr<LogOutput> *)
        std::
        set<std::shared_ptr<LogOutput>,_std::less<std::shared_ptr<LogOutput>_>,_std::allocator<std::shared_ptr<LogOutput>_>_>
        ::end((set<std::shared_ptr<LogOutput>,_std::less<std::shared_ptr<LogOutput>_>,_std::allocator<std::shared_ptr<LogOutput>_>_>
               *)&lock);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&out);
    if (!bVar1) break;
    __args = std::_Rb_tree_const_iterator<std::shared_ptr<LogOutput>_>::operator*(&__end1);
    std::function<void_(const_std::shared_ptr<LogOutput>_&)>::operator()(in_RDI,__args);
    std::_Rb_tree_const_iterator<std::shared_ptr<LogOutput>_>::operator++(&__end1);
  }
  Set<std::shared_ptr<LogOutput>_>::~Set((Set<std::shared_ptr<LogOutput>_> *)&lock);
  return extraout_XMM0_Qa;
}

Assistant:

void log(const std::function<void(const std::shared_ptr<LogOutput> &)> &func)
{
    Set<std::shared_ptr<LogOutput> > logs;
    {
        std::lock_guard<std::mutex> lock(sOutputsMutex);
        logs = sOutputs;
    }
    for (const auto &out : logs) {
        func(out);
    }
}